

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::SamplePosRasterizationTest
          (SamplePosRasterizationTest *this,Context *context,char *name,char *desc,int samples)

{
  int samples_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  SamplePosRasterizationTest *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SamplePosRasterizationTest_032b8518;
  this->m_samples = samples;
  this->m_canvasSize = 0x100;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
  ::vector(&this->m_testTriangles);
  this->m_iteration = 0;
  this->m_allIterationsOk = true;
  this->m_texID = 0;
  this->m_vaoID = 0;
  this->m_vboID = 0;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&this->m_samplePositions);
  this->m_subpixelBits = 0;
  this->m_samplerProgram = (ShaderProgram *)0x0;
  this->m_samplerProgramPosLoc = -1;
  this->m_samplerProgramSamplerLoc = -1;
  this->m_samplerProgramSampleNdxLoc = -1;
  return;
}

Assistant:

SamplePosRasterizationTest::SamplePosRasterizationTest (Context& context, const char* name, const char* desc, int samples)
	: TestCase						(context, name, desc)
	, m_samples						(samples)
	, m_canvasSize					(256)
	, m_iteration					(0)
	, m_allIterationsOk				(true)
	, m_texID						(0)
	, m_vaoID						(0)
	, m_vboID						(0)
	, m_subpixelBits				(0)
	, m_samplerProgram				(DE_NULL)
	, m_samplerProgramPosLoc		(-1)
	, m_samplerProgramSamplerLoc	(-1)
	, m_samplerProgramSampleNdxLoc	(-1)
{
}